

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdef.c
# Opt level: O0

void parse_tmat_senmap(mdef_t *m,char *line,int32 off,s3pid_t p)

{
  int iVar1;
  char *local_440;
  char *lp;
  char word [1024];
  uint local_2c;
  uint local_28;
  int32 s;
  int32 n;
  int32 wlen;
  s3pid_t p_local;
  int32 off_local;
  char *line_local;
  mdef_t *m_local;
  
  n = p;
  wlen = off;
  _p_local = line;
  line_local = (char *)m;
  iVar1 = __isoc99_sscanf(line + off,"%d%n",&local_28,&s);
  if ((iVar1 != 1) || ((int)local_28 < 0)) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
            ,0x1b8,"Missing or bad transition matrix id: %s\n",_p_local);
    exit(1);
  }
  *(uint *)(*(long *)(line_local + 0x28) + (long)n * 0x20 + 4) = local_28;
  if (*(int *)(line_local + 0x14) <= (int)local_28) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
            ,0x1bc,"tmat-id(%d) > #tmat in header(%d): %s\n",(ulong)local_28,
            (ulong)*(uint *)(line_local + 0x14),_p_local);
    exit(1);
  }
  local_440 = line + off + s;
  local_28 = 0;
  while( true ) {
    if (*(int *)(line_local + 8) <= (int)local_28) {
      iVar1 = __isoc99_sscanf(local_440,"%s%n",&lp,&s);
      if (iVar1 == 1) {
        iVar1 = strcmp((char *)&lp,"N");
        if (iVar1 == 0) {
          iVar1 = __isoc99_sscanf(local_440 + s,"%s%n",&lp,&s);
          if (iVar1 == 1) {
            err_msg(ERR_FATAL,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
                    ,0x1da,"Non-empty beyond non-emitting final state: %s\n",_p_local);
            exit(1);
          }
          return;
        }
      }
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
              ,0x1d5,"Missing non-emitting state spec: %s\n",_p_local);
      exit(1);
    }
    iVar1 = __isoc99_sscanf(local_440,"%d%n",&local_2c,&s);
    if ((iVar1 != 1) || ((int)local_2c < 0)) break;
    *(short *)(*(long *)(*(long *)(line_local + 0x28) + (long)n * 0x20 + 0x18) +
              (long)(int)local_28 * 2) = (short)local_2c;
    if ((n < *(int *)line_local) && (*(int *)(line_local + 0xc) <= (int)local_2c)) {
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
              ,0x1ca,"CI-senone-id(%d) > #CI-senones(%d): %s\n",(ulong)local_2c,
              (ulong)*(uint *)(line_local + 0xc),_p_local);
      exit(1);
    }
    if (*(int *)(line_local + 0x10) <= (int)local_2c) {
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
              ,0x1cd,"Senone-id(%d) > #senones(%d): %s\n",(ulong)local_2c,
              (ulong)*(uint *)(line_local + 0x10),_p_local);
      exit(1);
    }
    *(short *)(*(long *)(*(long *)(line_local + 0x30) + (long)n * 8) + (long)(int)local_28 * 2) =
         (short)local_2c;
    local_440 = local_440 + s;
    local_28 = local_28 + 1;
  }
  err_msg(ERR_FATAL,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/mdef.c"
          ,0x1c3,"Missing or bad state[%d]->senone mapping: %s\n",(ulong)local_28,_p_local);
  exit(1);
}

Assistant:

static void
parse_tmat_senmap(mdef_t * m, const char *line, int32 off, s3pid_t p)
{
    int32 wlen, n, s;
    char word[1024];
    const char *lp;

    lp = line + off;

    /* Read transition matrix id */
    if ((sscanf(lp, "%d%n", &n, &wlen) != 1) || (n < 0))
        E_FATAL("Missing or bad transition matrix id: %s\n", line);
    m->phone[p].tmat = n;
    if (m->n_tmat <= n)
        E_FATAL("tmat-id(%d) > #tmat in header(%d): %s\n", n, m->n_tmat,
                line);
    lp += wlen;

    /* Read senone mappings for each emitting state */
    for (n = 0; n < m->n_emit_state; n++) {
        if ((sscanf(lp, "%d%n", &s, &wlen) != 1) || (s < 0))
            E_FATAL("Missing or bad state[%d]->senone mapping: %s\n", n,
                    line);

        /*20040821 ARCHAN, This line is added to allow 3.x/3.0 compatability. */
        m->phone[p].state[n] = s;

        if ((p < m->n_ciphone) && (m->n_ci_sen <= s))
            E_FATAL("CI-senone-id(%d) > #CI-senones(%d): %s\n", s,
                    m->n_ci_sen, line);
        if (m->n_sen <= s)
            E_FATAL("Senone-id(%d) > #senones(%d): %s\n", s, m->n_sen,
                    line);

        m->sseq[p][n] = s;
        lp += wlen;
    }

    /* Check for the last non-emitting state N */
    if ((sscanf(lp, "%s%n", word, &wlen) != 1) || (strcmp(word, "N") != 0))
        E_FATAL("Missing non-emitting state spec: %s\n", line);
    lp += wlen;

    /* Check for end of line */
    if (sscanf(lp, "%s%n", word, &wlen) == 1)
        E_FATAL("Non-empty beyond non-emitting final state: %s\n", line);
}